

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

string * __thiscall jwt::header::get_algorithm_abi_cxx11_(header *this)

{
  claim *this_00;
  string *psVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"alg",&local_31);
  this_00 = get_header_claim(this,&local_30);
  psVar1 = claim::as_string_abi_cxx11_(this_00);
  std::__cxx11::string::~string((string *)&local_30);
  return psVar1;
}

Assistant:

const std::string& get_algorithm() const { return get_header_claim("alg").as_string(); }